

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

void __thiscall
cmsys::anon_unknown_3::SymbolProperties::SetFunction(SymbolProperties *this,char *function)

{
  size_t sVar1;
  void *__ptr;
  char *pcVar2;
  int status;
  int local_5c;
  long *local_58;
  char *local_50;
  long local_48 [2];
  undefined8 local_38;
  
  pcVar2 = "???";
  if (function != (char *)0x0) {
    pcVar2 = function;
  }
  local_58 = local_48;
  sVar1 = strlen(pcVar2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar2,pcVar2 + sVar1);
  local_5c = 0;
  local_38 = 0x400;
  __ptr = malloc(0x400);
  pcVar2 = (char *)__cxa_demangle(function,__ptr,&local_38,&local_5c);
  if (local_5c == 0) {
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)&local_58,0,local_50,(ulong)pcVar2);
  }
  free(__ptr);
  std::__cxx11::string::operator=((string *)&this->Function,(string *)&local_58);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void SetFunction(const char* function)
  {
    this->Function = this->Demangle(function);
  }